

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O2

void Corrade::Containers::ArrayMallocAllocator<char32_t>::reallocate
               (char32_t **array,size_t param_2,size_t newCapacity)

{
  size_t __size;
  size_t *psVar1;
  ostream *output;
  Debug *pDVar2;
  Error EStack_38;
  
  __size = newCapacity * 4 + 8;
  psVar1 = (size_t *)realloc(*array + -2,__size);
  if (psVar1 != (size_t *)0x0) {
    *psVar1 = __size;
    *array = (char32_t *)(psVar1 + 1);
    return;
  }
  output = Utility::Error::defaultOutput();
  Utility::Error::Error(&EStack_38,output,(Flags)0x0);
  pDVar2 = Utility::Debug::operator<<
                     (&EStack_38.super_Debug,"Containers::ArrayMallocAllocator: can\'t reallocate");
  pDVar2 = Utility::Debug::operator<<(pDVar2,__size);
  Utility::Debug::operator<<(pDVar2,"bytes");
  Utility::Error::~Error(&EStack_38);
  abort();
}

Assistant:

void ArrayMallocAllocator<T>::reallocate(T*& array, std::size_t, const std::size_t newCapacity) {
    const std::size_t inBytes = newCapacity*sizeof(T) + AllocationOffset;
    char* const memory = static_cast<char*>(std::realloc(reinterpret_cast<char*>(array) - AllocationOffset, inBytes));
    CORRADE_ASSERT(memory,
        "Containers::ArrayMallocAllocator: can't reallocate" << inBytes << "bytes", );
    reinterpret_cast<std::size_t*>(memory)[0] = inBytes;
    array = reinterpret_cast<T*>(memory + AllocationOffset);
}